

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O1

void GA_Dgemm64_c(char ta,char tb,int64_t m,int64_t n,int64_t k,double alpha,int g_a,int g_b,
                 double beta,int g_c)

{
  char tb_local;
  char ta_local;
  double beta_local;
  double alpha_local;
  
  tb_local = tb;
  ta_local = ta;
  beta_local = beta;
  alpha_local = alpha;
  pnga_matmul(&ta_local,&tb_local,&alpha_local,&beta_local,(long)g_a,1,m,1,k,(long)g_b,1,k,1,n,
              (long)g_c,1,m,1,n);
  return;
}

Assistant:

void GA_Dgemm64_c(char ta, char tb, int64_t m, int64_t n, int64_t k,
                double alpha, int g_a, int g_b, double beta, int g_c )
{
  Integer G_a = g_a;
  Integer G_b = g_b;
  Integer G_c = g_c;

  Integer ailo = 1;
  Integer aihi = m;
  Integer ajlo = 1;
  Integer ajhi = k;
  
  Integer bilo = 1;
  Integer bihi = k;
  Integer bjlo = 1;
  Integer bjhi = n;
  
  Integer cilo = 1;
  Integer cihi = m;
  Integer cjlo = 1;
  Integer cjhi = n;
  
  pnga_matmul(&ta, &tb, (DoublePrecision *)&alpha,(DoublePrecision *)&beta,
	    G_a, ailo, aihi, ajlo, ajhi,
	    G_b, bilo, bihi, bjlo, bjhi,
	    G_c, cilo, cihi, cjlo, cjhi);
}